

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsa.c
# Opt level: O0

key_components * dsa_components(ssh_key *key)

{
  key_components *kc_00;
  key_components *kc;
  dsa_key *dsa;
  ssh_key *key_local;
  
  kc_00 = key_components_new();
  key_components_add_text(kc_00,"key_type","DSA");
  if (key[-5].vt != (ssh_keyalg *)0x0) {
    key_components_add_mp(kc_00,"p",(mp_int *)key[-5].vt);
    key_components_add_mp(kc_00,"q",(mp_int *)key[-4].vt);
    key_components_add_mp(kc_00,"g",(mp_int *)key[-3].vt);
    key_components_add_mp(kc_00,"public_y",(mp_int *)key[-2].vt);
    if (key[-1].vt != (ssh_keyalg *)0x0) {
      key_components_add_mp(kc_00,"private_x",(mp_int *)key[-1].vt);
    }
    return kc_00;
  }
  __assert_fail("dsa->p",
                "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/crypto/dsa.c",
                0x5e,"key_components *dsa_components(ssh_key *)");
}

Assistant:

static key_components *dsa_components(ssh_key *key)
{
    struct dsa_key *dsa = container_of(key, struct dsa_key, sshk);
    key_components *kc = key_components_new();

    key_components_add_text(kc, "key_type", "DSA");
    assert(dsa->p);
    key_components_add_mp(kc, "p", dsa->p);
    key_components_add_mp(kc, "q", dsa->q);
    key_components_add_mp(kc, "g", dsa->g);
    key_components_add_mp(kc, "public_y", dsa->y);
    if (dsa->x)
        key_components_add_mp(kc, "private_x", dsa->x);

    return kc;
}